

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

bool __thiscall
BlurayHelper::createMPLSFile
          (BlurayHelper *this,TSMuxer *mainMuxer,TSMuxer *subMuxer,int autoChapterLen,
          vector<double,_std::allocator<double>_> *customChapters,DiskType dt,int mplsOffset,
          bool isMvcBaseViewR)

{
  _Rb_tree_color index;
  long lVar1;
  long lVar2;
  double *pdVar3;
  _Base_ptr p_Var4;
  BlurayHelper *pBVar5;
  pointer pMVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  PMTStreamInfo *pPVar11;
  MPLSStreamInfo *pMVar12;
  PMTStreamInfo *pPVar13;
  _Base_ptr p_Var14;
  ostream *poVar15;
  File *this_00;
  _func_int *p_Var16;
  bool bVar17;
  char *pcVar18;
  const_iterator __begin2;
  double *pdVar19;
  allocator<char> local_2f7;
  allocator<char> local_2f6;
  allocator<char> local_2f5;
  DiskType local_2f4;
  uint8_t *local_2f0;
  undefined **local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  TSMuxer *local_220;
  BlurayHelper *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string dstDir;
  PIDListMap pidList;
  PIDListMap pidListMVC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  MPLSParser mplsParser;
  string prefix;
  
  local_2e8 = (undefined **)CONCAT44(local_2e8._4_4_,autoChapterLen);
  local_2f4 = dt;
  local_220 = subMuxer;
  local_218 = this;
  TSMuxer::getFirstPts((vector<long,_std::allocator<long>_> *)&mplsParser,mainMuxer);
  lVar1 = *(long *)CONCAT44(mplsParser.playback_count,mplsParser.PlayList_playback_type);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&mplsParser);
  TSMuxer::getLastPts((vector<long,_std::allocator<long>_> *)&mplsParser,mainMuxer);
  lVar2 = *(long *)(CONCAT17(mplsParser.number_of_angles,
                             CONCAT16(mplsParser.PlayItem_random_access_flag,
                                      CONCAT15(mplsParser.ref_to_STC_id,mplsParser._8_5_))) + -8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&mplsParser);
  local_2f0 = (uint8_t *)operator_new__(0x19000);
  MPLSParser::MPLSParser(&mplsParser);
  mplsParser.m_m2tsOffset = TSMuxer::getFirstFileNum(mainMuxer);
  mplsParser.PlayList_playback_type = 1;
  mplsParser.ref_to_STC_id = '\0';
  mplsParser.IN_time = (uint32_t)(lVar1 / 2);
  mplsParser.OUT_time = (uint32_t)(lVar2 / 2);
  mplsParser.mvc_base_view_r = isMvcBaseViewR;
  pdVar19 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar3 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar19 == pdVar3) {
    mplsParser.m_chapterLen = (int)local_2e8;
  }
  else {
    for (; pdVar19 != pdVar3; pdVar19 = pdVar19 + 1) {
      uVar8 = (uint)(long)(*pdVar19 * 45000.0);
      if (uVar8 <= mplsParser.OUT_time - mplsParser.IN_time) {
        prefix._M_dataplus._M_p._0_4_ = 0xffffffff;
        pidList._M_t._M_impl._0_4_ = mplsParser.IN_time + uVar8;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)&mplsParser.m_marks,
                   (int *)&prefix,(uint *)&pidList);
      }
    }
  }
  mplsParser.PlayItem_random_access_flag = false;
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::_Rb_tree(&pidList._M_t,&(mainMuxer->m_pmt).pidList._M_t);
  pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header;
  pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pidListMVC._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_220 != (TSMuxer *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
    ::operator=(&pidListMVC._M_t,&(local_220->m_pmt).pidList._M_t);
  }
  local_2e8 = &PTR__PGSStreamReader_0024c208;
  for (p_Var14 = pidList._M_t._M_impl.super__Rb_tree_header._M_header._M_left; pBVar5 = local_218,
      (_Rb_tree_header *)p_Var14 != &pidList._M_t._M_impl.super__Rb_tree_header;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>>::emplace_back<PMTStreamInfo&>
              ((vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>> *)&mplsParser.m_streamInfo,
               (PMTStreamInfo *)&p_Var14[1]._M_parent);
    pMVar6 = mplsParser.m_streamInfo.
             super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    p_Var4 = p_Var14[6]._M_right;
    if ((p_Var4 != (_Base_ptr)0x0) && (*(undefined ***)p_Var4 == local_2e8)) {
      mplsParser.m_streamInfo.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].offsetId =
           *(uint8_t *)((long)&p_Var4[0xe]._M_right + 6);
      mplsParser.m_streamInfo.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].SS_PG_offset_sequence_id =
           *(int *)&p_Var4[3].field_0x4;
      bVar17 = *(bool *)&p_Var4[2]._M_right;
      mplsParser.m_streamInfo.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].isSSPG = bVar17;
      if (bVar17 == true) {
        iVar9 = *(int *)((long)&p_Var4[2]._M_right + 4);
        pPVar11 = streamByIndex(iVar9,&pidList);
        pPVar13 = pPVar11;
        if ((pPVar11 != (PMTStreamInfo *)0x0) ||
           (pPVar13 = streamByIndex(iVar9,&pidListMVC), pPVar13 != (PMTStreamInfo *)0x0)) {
          pMVar12 = (MPLSStreamInfo *)operator_new(0x70);
          MPLSStreamInfo::MPLSStreamInfo(pMVar12,pPVar13);
          pMVar6[-1].leftEye = pMVar12;
          if (pPVar11 == (PMTStreamInfo *)0x0) {
            pMVar12->type = '\x02';
          }
        }
        index = p_Var4[3]._M_color;
        pPVar11 = streamByIndex(index,&pidList);
        pPVar13 = pPVar11;
        if ((pPVar11 != (PMTStreamInfo *)0x0) ||
           (pPVar13 = streamByIndex(index,&pidListMVC), pPVar13 != (PMTStreamInfo *)0x0)) {
          pMVar12 = (MPLSStreamInfo *)operator_new(0x70);
          MPLSStreamInfo::MPLSStreamInfo(pMVar12,pPVar13);
          pMVar6[-1].rightEye = pMVar12;
          if (pPVar11 == (PMTStreamInfo *)0x0) {
            pMVar12->type = '\x02';
          }
        }
      }
    }
  }
  if (local_220 != (TSMuxer *)0x0) {
    mplsParser.isDependStreamExist = true;
    for (p_Var14 = pidListMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var14 != &pidListMVC._M_t._M_impl.super__Rb_tree_header;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
      MPLSStreamInfo::MPLSStreamInfo
                ((MPLSStreamInfo *)&prefix,(PMTStreamInfo *)&p_Var14[1]._M_parent);
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                (&mplsParser.m_streamInfoMVC,(MPLSStreamInfo *)&prefix);
      MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)&prefix);
    }
  }
  pcVar18 = "Creating AVCHD playlist";
  if (local_2f4 == BLURAY) {
    pcVar18 = "Creating Blu-ray playlist";
  }
  poVar15 = std::operator<<((ostream *)&std::cout,pcVar18);
  std::endl<char,std::char_traits<char>>(poVar15);
  sLastMsg = true;
  uVar8 = MPLSParser::compose(&mplsParser,local_2f0,0x19000,local_2f4);
  if (pBVar5->m_isoWriter == (IsoWriter *)0x0) {
    std::__cxx11::string::string((string *)&prefix,(string *)&pBVar5->m_dstPath);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"",(allocator<char> *)&dstDir);
  }
  if (pBVar5->m_isoWriter == (IsoWriter *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
  }
  else {
    this_00 = (File *)IsoWriter::createFile(pBVar5->m_isoWriter);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"BDMV",(allocator<char> *)&local_240);
  cVar7 = getDirSeparator();
  std::operator+(&local_2a0,&local_2c0,cVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"PLAYLIST",(allocator<char> *)&local_260);
  std::operator+(&local_280,&local_2a0,&local_2e0);
  cVar7 = getDirSeparator();
  std::operator+(&dstDir,&local_280,cVar7);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::operator+(&local_2c0,&prefix,&dstDir);
  int32ToStr_abi_cxx11_(&local_240,&mplsOffset);
  strPadLeft(&local_2e0,&local_240,5,'0');
  std::operator+(&local_2a0,&local_2c0,&local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,".mpls",(allocator<char> *)&local_210);
  std::operator+(&local_280,&local_2a0,&local_260);
  iVar9 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                    (this_00,local_280._M_dataplus._M_p,2,0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_2c0);
  if ((char)iVar9 != '\0') {
    uVar10 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                       (this_00,local_2f0,(ulong)uVar8);
    p_Var16 = (this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3];
    if (uVar10 == uVar8) {
      (*p_Var16)(this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"BDMV",&local_2f5);
      cVar7 = getDirSeparator();
      std::operator+(&local_240,&local_260,cVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"BACKUP",&local_2f6);
      std::operator+(&local_2e0,&local_240,&local_210);
      cVar7 = getDirSeparator();
      std::operator+(&local_2c0,&local_2e0,cVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"PLAYLIST",&local_2f7)
      ;
      std::operator+(&local_2a0,&local_2c0,&local_170);
      cVar7 = getDirSeparator();
      std::operator+(&local_280,&local_2a0,cVar7);
      std::__cxx11::string::operator=((string *)&dstDir,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::operator+(&local_2c0,&prefix,&dstDir);
      int32ToStr_abi_cxx11_(&local_240,&mplsOffset);
      strPadLeft(&local_2e0,&local_240,5,'0');
      std::operator+(&local_2a0,&local_2c0,&local_2e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,".mpls",(allocator<char> *)&local_210);
      std::operator+(&local_280,&local_2a0,&local_260);
      iVar9 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                        (this_00,local_280._M_dataplus._M_p,2,0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_2c0);
      if ((char)iVar9 == '\0') goto LAB_001903cf;
      uVar10 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                         (this_00,local_2f0,(ulong)uVar8);
      p_Var16 = (this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3];
      if (uVar10 == uVar8) {
        bVar17 = true;
        (*p_Var16)(this_00);
        goto LAB_001903d1;
      }
    }
    (*p_Var16)(this_00);
  }
LAB_001903cf:
  bVar17 = false;
LAB_001903d1:
  operator_delete__(local_2f0);
  (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(this_00);
  std::__cxx11::string::~string((string *)&dstDir);
  std::__cxx11::string::~string((string *)&prefix);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&pidListMVC._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&pidList._M_t);
  MPLSParser::~MPLSParser(&mplsParser);
  return bVar17;
}

Assistant:

bool BlurayHelper::createMPLSFile(TSMuxer* mainMuxer, TSMuxer* subMuxer, int autoChapterLen,
                                  const vector<double>& customChapters, DiskType dt, int mplsOffset,
                                  bool isMvcBaseViewR) const
{
    int64_t firstPts = *(mainMuxer->getFirstPts().begin());
    int64_t lastPts = *(mainMuxer->getLastPts().rbegin());

    int bufSize = 1024 * 100;
    auto mplsBuffer = new uint8_t[bufSize];
    MPLSParser mplsParser;
    mplsParser.m_m2tsOffset = mainMuxer->getFirstFileNum();
    mplsParser.PlayList_playback_type = 1;
    mplsParser.ref_to_STC_id = 0;
    mplsParser.IN_time = static_cast<uint32_t>(firstPts / 2);
    mplsParser.OUT_time = static_cast<uint32_t>(lastPts / 2);
    mplsParser.mvc_base_view_r = isMvcBaseViewR;

    if (customChapters.empty())
    {
        mplsParser.m_chapterLen = autoChapterLen;
    }
    else
    {
        for (auto& i : customChapters)
        {
            auto mark = static_cast<uint32_t>(i * 45000.0);
            if (mark <= (mplsParser.OUT_time - mplsParser.IN_time))
                mplsParser.m_marks.emplace_back(-1, mark + mplsParser.IN_time);
        }
    }
    mplsParser.PlayItem_random_access_flag = false;
    PIDListMap pidList = mainMuxer->getPidList();
    PIDListMap pidListMVC;
    if (subMuxer)
        pidListMVC = subMuxer->getPidList();

    for (auto& [index, si] : pidList)
    {
        mplsParser.m_streamInfo.emplace_back(si);
        MPLSStreamInfo& info = *mplsParser.m_streamInfo.rbegin();
        auto pgStream = dynamic_cast<PGSStreamReader*>(si.m_codecReader);
        if (pgStream)
        {
            info.offsetId = pgStream->getOffsetId();
            info.SS_PG_offset_sequence_id = pgStream->ssPGOffset;
            info.isSSPG = pgStream->isSSPG;
            if (info.isSSPG)
            {
                bool isSecondary = false;
                const PMTStreamInfo* left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidList);
                if (!left)
                {
                    left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (left)
                {
                    info.leftEye = new MPLSStreamInfo(*left);
                    if (isSecondary)
                        info.leftEye->type = 2;  // ref to subclip
                }

                isSecondary = false;
                const PMTStreamInfo* right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidList);
                if (!right)
                {
                    right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (right)
                {
                    info.rightEye = new MPLSStreamInfo(*right);
                    if (isSecondary)
                        info.rightEye->type = 2;  // ref to subclip
                }
            }
        }
    }
    if (subMuxer)
    {
        mplsParser.isDependStreamExist = true;
        for (const auto& [pid, si] : pidListMVC)
        {
            MPLSStreamInfo data(si);
            data.type = 2;  // Identify an elementary stream of the Clip used by a SubPath with SubPath_type set to
                            // 2,3,4,5,6,8 or 9
            mplsParser.m_streamInfoMVC.push_back(data);
        }
    }

    if (dt == DiskType::BLURAY)
    {
        LTRACE(LT_INFO, 2, "Creating Blu-ray playlist");
    }
    else
    {
        LTRACE(LT_INFO, 2, "Creating AVCHD playlist");
    }
    int fileLen = mplsParser.compose(mplsBuffer, bufSize, dt);

    string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    string dstDir = string("BDMV") + getDirSeparator() + string("PLAYLIST") + getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();

    dstDir = string("BDMV") + getDirSeparator() + string("BACKUP") + getDirSeparator() + string("PLAYLIST") +
             getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();
    delete[] mplsBuffer;
    delete file;
    return true;
}